

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

double Internal_ScaleOverrideLength
                 (double parent_dimstyle_length,double current_dimstyle_length,double scale)

{
  undefined8 local_48;
  double delta;
  double abs_tol;
  double rel_tol;
  double x;
  double scale_local;
  double current_dimstyle_length_local;
  double parent_dimstyle_length_local;
  
  local_48 = current_dimstyle_length * scale;
  if ((ABS(local_48 - parent_dimstyle_length) <= ABS(parent_dimstyle_length) * 1e-06) ||
     (ABS(local_48 - parent_dimstyle_length) <= 2.3283064365386963e-10)) {
    local_48 = parent_dimstyle_length;
  }
  return local_48;
}

Assistant:

double Internal_ScaleOverrideLength(
  double parent_dimstyle_length,
  double current_dimstyle_length,
  double scale
)
{
  // returns scaled dimstyle length
  const double x = current_dimstyle_length * scale;
  const double rel_tol = 1.0e-6 * fabs(parent_dimstyle_length);
  const double abs_tol = ON_ZERO_TOLERANCE;
  const double delta = fabs(x - parent_dimstyle_length);
  return (delta <= rel_tol || delta <= abs_tol) ? parent_dimstyle_length : x;
}